

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_reactor.hpp
# Opt level: O2

void __thiscall
asio::detail::epoll_reactor::
schedule_timer<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
          (epoll_reactor *this,
          timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          *queue,time_type *time,per_timer_data *timer,wait_op *op)

{
  long *plVar1;
  bool bVar2;
  scoped_lock lock;
  scoped_lock sStack_38;
  
  conditionally_enabled_mutex::scoped_lock::scoped_lock
            (&sStack_38,(conditionally_enabled_mutex *)&(this->mutex_).mutex_);
  if (*(char *)&this->registered_descriptors_mutex_ == '\x01') {
    scheduler::post_immediate_completion(*(scheduler **)&this->mutex_,&op->super_operation,false);
  }
  else {
    bVar2 = timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
            ::enqueue_timer(queue,time,timer,op);
    LOCK();
    plVar1 = (long *)(*(long *)&this->mutex_ + 0xd8);
    *plVar1 = *plVar1 + 1;
    UNLOCK();
    if (bVar2) {
      update_timeout(this);
    }
  }
  conditionally_enabled_mutex::scoped_lock::~scoped_lock(&sStack_38);
  return;
}

Assistant:

void epoll_reactor::schedule_timer(timer_queue<Time_Traits>& queue,
    const typename Time_Traits::time_type& time,
    typename timer_queue<Time_Traits>::per_timer_data& timer, wait_op* op)
{
  mutex::scoped_lock lock(mutex_);

  if (shutdown_)
  {
    scheduler_.post_immediate_completion(op, false);
    return;
  }

  bool earliest = queue.enqueue_timer(time, timer, op);
  scheduler_.work_started();
  if (earliest)
    update_timeout();
}